

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgc2mgc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined7 uVar6;
  ostream *poVar5;
  ostringstream *this;
  long lVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  allocator local_4e9;
  int output_num_order;
  int input_num_order;
  double input_gamma;
  ulong local_4d8;
  ulong local_4d0;
  double output_gamma;
  undefined8 local_4c0;
  double output_alpha;
  double input_alpha;
  string local_4a8;
  vector<double,_std::allocator<double>_> mel_generalized_cepstrum;
  MelGeneralizedCepstrumToMelGeneralizedCepstrum mel_generalized_cepstrum_transform;
  vector<double,_std::allocator<double>_> transformed_mel_generalized_cepstrum;
  ostringstream error_message_11;
  Buffer buffer;
  ifstream ifs;
  byte abStack_218 [488];
  
  output_num_order = 0x19;
  input_alpha = 0.0;
  input_gamma = 0.0;
  output_alpha = 0.0;
  output_gamma = 1.0;
  local_4c0 = 0;
  local_4d8 = 0;
  local_4d0 = 0;
  input_num_order = output_num_order;
  bVar2 = false;
LAB_0010369c:
  do {
    bVar1 = bVar2;
    iVar4 = ya_getopt_long(argc,argv,"m:a:g:c:nuM:A:G:C:NUh",(option *)0x0,(int *)0x0);
    bVar2 = bVar1;
    if (iVar4 - 0x61U < 0xe) {
      switch(iVar4) {
      case 0x61:
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
        bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&input_alpha);
        if (bVar1) {
          bVar1 = sptk::IsValidAlpha(input_alpha);
          std::__cxx11::string::~string((string *)&ifs);
          if (bVar1) break;
        }
        else {
          std::__cxx11::string::~string((string *)&ifs);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -a option must be in (-1.0, 1.0)");
        std::__cxx11::string::string
                  ((string *)&error_message_11,"mgc2mgc",
                   (allocator *)&mel_generalized_cepstrum_transform);
        sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
        goto LAB_00103da8;
      default:
        goto switchD_00103709_caseD_62;
      case 99:
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
        bVar10 = sptk::ConvertStringToInteger
                           ((string *)&ifs,(int *)&mel_generalized_cepstrum_transform);
        bVar1 = (int)mel_generalized_cepstrum_transform.
                     _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum < 1;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar10 || bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,
                          "The argument for the -c option must be a positive integer");
          std::__cxx11::string::string((string *)&error_message_11,"mgc2mgc",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
          goto LAB_00103da8;
        }
        input_gamma = -1.0 / (double)(int)mel_generalized_cepstrum_transform.
                                          _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
        break;
      case 0x67:
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
        bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&input_gamma);
        if (bVar1) {
          bVar1 = sptk::IsValidGamma(input_gamma);
          std::__cxx11::string::~string((string *)&ifs);
          if (bVar1) break;
        }
        else {
          std::__cxx11::string::~string((string *)&ifs);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -g option must be in [-1.0, 1.0]");
        std::__cxx11::string::string
                  ((string *)&error_message_11,"mgc2mgc",
                   (allocator *)&mel_generalized_cepstrum_transform);
        sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
        goto LAB_00103da8;
      case 0x68:
        anon_unknown.dwarf_2c41::PrintUsage((ostream *)&std::cout);
        return 0;
      case 0x6d:
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
        bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&input_num_order);
        bVar10 = input_num_order < 0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar1 || bVar10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
          std::operator<<(poVar5,"non-negative integer");
          std::__cxx11::string::string
                    ((string *)&error_message_11,"mgc2mgc",
                     (allocator *)&mel_generalized_cepstrum_transform);
          sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
          goto LAB_00103da8;
        }
        break;
      case 0x6e:
        local_4d0 = CONCAT71((int7)((ulong)((long)&switchD_00103709::switchdataD_0010d018 +
                                           (long)(int)(&switchD_00103709::switchdataD_0010d018)
                                                      [iVar4 - 0x61U]) >> 8),1);
      }
      goto LAB_0010369c;
    }
    if (iVar4 == 0x41) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&output_alpha);
      if (bVar1) {
        bVar1 = sptk::IsValidAlpha(output_alpha);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) goto LAB_0010369c;
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -A option must be in (-1.0, 1.0)");
      std::__cxx11::string::string
                ((string *)&error_message_11,"mgc2mgc",
                 (allocator *)&mel_generalized_cepstrum_transform);
      sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
      goto LAB_00103da8;
    }
    if (iVar4 == 0x43) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
      bVar10 = sptk::ConvertStringToInteger
                         ((string *)&ifs,(int *)&mel_generalized_cepstrum_transform);
      bVar1 = (int)mel_generalized_cepstrum_transform.
                   _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar10 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -C option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_11,"mgc2mgc",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
        goto LAB_00103da8;
      }
      output_gamma = -1.0 / (double)(int)mel_generalized_cepstrum_transform.
                                         _vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum;
      goto LAB_0010369c;
    }
    if (iVar4 == 0x47) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
      bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&output_gamma);
      if (bVar1) {
        bVar1 = sptk::IsValidGamma(output_gamma);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) goto LAB_0010369c;
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -G option must be in [-1.0, 1.0]");
      std::__cxx11::string::string
                ((string *)&error_message_11,"mgc2mgc",
                 (allocator *)&mel_generalized_cepstrum_transform);
      sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
      goto LAB_00103da8;
    }
    if (iVar4 == 0x4d) {
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_11);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&output_num_order);
      bVar10 = output_num_order < 0;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -M option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::__cxx11::string::string
                  ((string *)&error_message_11,"mgc2mgc",
                   (allocator *)&mel_generalized_cepstrum_transform);
        sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
        goto LAB_00103da8;
      }
      goto LAB_0010369c;
    }
    uVar6 = (undefined7)(CONCAT44(extraout_var,iVar4) >> 8);
    if (iVar4 == 0x4e) {
      local_4d8 = CONCAT71(uVar6,1);
      goto LAB_0010369c;
    }
    if (iVar4 == 0x55) {
      local_4c0 = CONCAT71(uVar6,1);
      goto LAB_0010369c;
    }
    bVar2 = true;
  } while (iVar4 == 0x75);
  if (iVar4 != -1) {
switchD_00103709_caseD_62:
    anon_unknown.dwarf_2c41::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  if (((input_gamma != 0.0) || (NAN(input_gamma))) || (!bVar1)) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (bVar2) {
        std::ifstream::ifstream(this);
        if ((pcVar8 == (char *)0x0) ||
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            this = (ostringstream *)&std::cin;
          }
          sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
          MelGeneralizedCepstrumToMelGeneralizedCepstrum
                    (&mel_generalized_cepstrum_transform,input_num_order,input_alpha,input_gamma,
                     (bool)((byte)local_4d0 & 1),bVar1,output_num_order,output_alpha,output_gamma,
                     (bool)((byte)local_4d8 & 1),(bool)((byte)local_4c0 & 1));
          buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00113a20;
          buffer.frequency_transform_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00113a50;
          buffer.frequency_transform_buffer_.d_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          buffer.frequency_transform_buffer_.d_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          buffer.frequency_transform_buffer_.d_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          buffer.temporary_mel_generalized_cepstrum_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          buffer.temporary_mel_generalized_cepstrum_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          buffer.temporary_mel_generalized_cepstrum_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (mel_generalized_cepstrum_transform.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_11);
            poVar5 = std::operator<<((ostream *)&error_message_11,"Failed to initialize ");
            std::operator<<(poVar5,"MelGeneralizedCepstrumToMelGeneralizedCepstrum");
            std::__cxx11::string::string
                      ((string *)&local_4a8,"mgc2mgc",(allocator *)&mel_generalized_cepstrum);
            sptk::PrintErrorMessage(&local_4a8,&error_message_11);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_11);
            iVar4 = 1;
          }
          else {
            lVar7 = (long)input_num_order;
            lVar9 = (long)output_num_order;
            std::vector<double,_std::allocator<double>_>::vector
                      (&mel_generalized_cepstrum,lVar7 + 1U,(allocator_type *)&error_message_11);
            std::vector<double,_std::allocator<double>_>::vector
                      (&transformed_mel_generalized_cepstrum,lVar9 + 1U,
                       (allocator_type *)&error_message_11);
            local_4d0 = CONCAT71((int7)(local_4d0 >> 8),(byte)local_4d0 | bVar1 ^ 1U);
            local_4d8 = CONCAT71((int7)(local_4d8 >> 8),(byte)local_4d8 | (byte)local_4c0 ^ 1);
            do {
              bVar2 = sptk::ReadStream<double>
                                (false,0,0,(int)(lVar7 + 1U),&mel_generalized_cepstrum,
                                 (istream *)this,(int *)0x0);
              if (!bVar2) {
                iVar4 = 0;
                goto LAB_00104264;
              }
              if ((local_4d0 & 1) == 0) {
                *mel_generalized_cepstrum.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start =
                     (*mel_generalized_cepstrum.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + -1.0) / input_gamma;
              }
              bVar2 = sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
                                (&mel_generalized_cepstrum_transform,&mel_generalized_cepstrum,
                                 &transformed_mel_generalized_cepstrum,&buffer);
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_11);
                std::operator<<((ostream *)&error_message_11,
                                "Failed to run mel-generalized cepstral transformation");
                std::__cxx11::string::string((string *)&local_4a8,"mgc2mgc",&local_4e9);
                sptk::PrintErrorMessage(&local_4a8,&error_message_11);
                goto LAB_0010424a;
              }
              if ((local_4d8 & 1) == 0) {
                *transformed_mel_generalized_cepstrum.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start = *transformed_mel_generalized_cepstrum.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start * output_gamma + 1.0;
              }
              bVar2 = sptk::WriteStream<double>
                                (0,(int)(lVar9 + 1U),&transformed_mel_generalized_cepstrum,
                                 (ostream *)&std::cout,(int *)0x0);
            } while (bVar2);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_11);
            std::operator<<((ostream *)&error_message_11,"Failed to write mel-generalized cepstrum")
            ;
            std::__cxx11::string::string((string *)&local_4a8,"mgc2mgc",&local_4e9);
            sptk::PrintErrorMessage(&local_4a8,&error_message_11);
LAB_0010424a:
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_11);
            iVar4 = 1;
LAB_00104264:
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&transformed_mel_generalized_cepstrum.
                        super__Vector_base<double,_std::allocator<double>_>);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&mel_generalized_cepstrum.super__Vector_base<double,_std::allocator<double>_>
                      );
          }
          sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer(&buffer);
          sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
          ~MelGeneralizedCepstrumToMelGeneralizedCepstrum(&mel_generalized_cepstrum_transform);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_11);
          poVar5 = std::operator<<((ostream *)&error_message_11,"Cannot open file ");
          std::operator<<(poVar5,pcVar8);
          std::__cxx11::string::string
                    ((string *)&mel_generalized_cepstrum_transform,"mgc2mgc",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&mel_generalized_cepstrum_transform,&error_message_11);
          std::__cxx11::string::~string((string *)&mel_generalized_cepstrum_transform);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_11);
          iVar4 = 1;
        }
        std::ifstream::~ifstream(&ifs);
        return iVar4;
      }
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,"Cannot set translation mode");
      std::__cxx11::string::string
                ((string *)&error_message_11,"mgc2mgc",
                 (allocator *)&mel_generalized_cepstrum_transform);
      sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"Too many input files");
      std::__cxx11::string::string
                ((string *)&error_message_11,"mgc2mgc",
                 (allocator *)&mel_generalized_cepstrum_transform);
      sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"If -u option is given, input gamma must not be 0");
    std::__cxx11::string::string
              ((string *)&error_message_11,"mgc2mgc",
               (allocator *)&mel_generalized_cepstrum_transform);
    sptk::PrintErrorMessage((string *)&error_message_11,(ostringstream *)&ifs);
  }
LAB_00103da8:
  std::__cxx11::string::~string((string *)&error_message_11);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_num_order(kDefaultInputNumOrder);
  double input_alpha(kDefaultInputAlpha);
  double input_gamma(kDefaultInputGamma);
  bool input_normalization_flag(kDefaultInputNormalizationFlag);
  bool input_multiplication_flag(kDefaultInputMultiplicationFlag);
  int output_num_order(kDefaultOutputNumOrder);
  double output_alpha(kDefaultOutputAlpha);
  double output_gamma(kDefaultOutputGamma);
  bool output_normalization_flag(kDefaultOutputNormalizationFlag);
  bool output_multiplication_flag(kDefaultOutputMultiplicationFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:nuM:A:G:C:NUh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_num_order) ||
            input_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &input_alpha) ||
            !sptk::IsValidAlpha(input_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &input_gamma) ||
            !sptk::IsValidGamma(input_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        input_gamma = -1.0 / tmp;
        break;
      }
      case 'n': {
        input_normalization_flag = true;
        break;
      }
      case 'u': {
        input_multiplication_flag = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_num_order) ||
            output_num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'A': {
        if (!sptk::ConvertStringToDouble(optarg, &output_alpha) ||
            !sptk::IsValidAlpha(output_alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -A option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'G': {
        if (!sptk::ConvertStringToDouble(optarg, &output_gamma) ||
            !sptk::IsValidGamma(output_gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -G option must be in [-1.0, 1.0]";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -C option must be a positive integer";
          sptk::PrintErrorMessage("mgc2mgc", error_message);
          return 1;
        }
        output_gamma = -1.0 / tmp;
        break;
      }
      case 'N': {
        output_normalization_flag = true;
        break;
      }
      case 'U': {
        output_multiplication_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0.0 == input_gamma && input_multiplication_flag) {
    std::ostringstream error_message;
    error_message << "If -u option is given, input gamma must not be 0";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum
      mel_generalized_cepstrum_transform(
          input_num_order, input_alpha, input_gamma, input_normalization_flag,
          input_multiplication_flag, output_num_order, output_alpha,
          output_gamma, output_normalization_flag, output_multiplication_flag);
  sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer buffer;
  if (!mel_generalized_cepstrum_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "MelGeneralizedCepstrumToMelGeneralizedCepstrum";
    sptk::PrintErrorMessage("mgc2mgc", error_message);
    return 1;
  }

  const int input_length(input_num_order + 1);
  const int output_length(output_num_order + 1);
  std::vector<double> mel_generalized_cepstrum(input_length);
  std::vector<double> transformed_mel_generalized_cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &mel_generalized_cepstrum,
                          &input_stream, NULL)) {
    // Perform input modification: 1+g*mgc[0] -> mgc[0]
    if (!input_normalization_flag && input_multiplication_flag)
      (*mel_generalized_cepstrum.begin()) =
          (*(mel_generalized_cepstrum.begin()) - 1.0) / input_gamma;

    // Transform.
    if (!mel_generalized_cepstrum_transform.Run(
            mel_generalized_cepstrum, &transformed_mel_generalized_cepstrum,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral transformation";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }

    // Perform output modification: mgc[0] -> 1+g*mgc[0]
    if (!output_normalization_flag && output_multiplication_flag)
      (*transformed_mel_generalized_cepstrum.begin()) =
          *(transformed_mel_generalized_cepstrum.begin()) * output_gamma + 1.0;

    // Write results.
    if (!sptk::WriteStream(0, output_length,
                           transformed_mel_generalized_cepstrum, &std::cout,
                           NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgc2mgc", error_message);
      return 1;
    }
  }

  return 0;
}